

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O0

int Abc_NtkRetimeMinDelayTry
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fInitial,int nIterLimit,int *pIterBest
              ,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vCritical_00;
  char *pcVar6;
  Abc_Obj_t *pObj_00;
  int local_9c;
  int local_64;
  uint local_60;
  int LatchesBest;
  int DelayStart;
  int DelayBest;
  int DelayCur;
  int IterBest;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vValues;
  Vec_Ptr_t *vCritical;
  Abc_Ntk_t *pNtkNew;
  int *pIterBest_local;
  int nIterLimit_local;
  int fInitial_local;
  int fForward_local;
  int nDelayLim_local;
  Abc_Ntk_t *pNtk_local;
  
  vCritical = (Vec_Ptr_t *)0x0;
  pObj = (Abc_Obj_t *)0x0;
  local_60 = 0xffffffff;
  if (fInitial != 0) {
    if (fForward == 0) {
      pObj = (Abc_Obj_t *)Abc_NtkRetimeCollectLatchValues(pNtk);
      vCritical = (Vec_Ptr_t *)Abc_NtkRetimeBackwardInitialStart(pNtk);
    }
    else {
      Abc_NtkRetimeTranferToCopy(pNtk);
    }
  }
  if ((fVerbose != 0) && (fInitial == 0)) {
    printf("Performing analysis:\n");
  }
  LatchesBest = 1000000000;
  DelayBest = 0;
  local_64 = Abc_NtkLatchNum(pNtk);
  vCritical_00 = Vec_PtrAlloc(100);
  IterBest = 0;
  while( true ) {
    uVar1 = Abc_NtkRetimeTiming(pNtk,fForward,vCritical_00);
    if (IterBest == 0) {
      local_60 = uVar1;
    }
    if ((int)uVar1 < LatchesBest) {
      if ((fVerbose != 0) && (fInitial == 0)) {
        pcVar6 = "Bwd";
        if (fForward != 0) {
          pcVar6 = "Fwd";
        }
        uVar2 = Abc_NtkLatchNum(pNtk);
        iVar3 = Abc_NtkLatchNum(pNtk);
        iVar4 = Abc_NtkLatchNum(pNtk);
        iVar5 = Abc_NtkLatchNum(pNtk);
        printf("%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n",
               ((double)(iVar3 - local_64) * 1.0) / (double)(int)(LatchesBest - uVar1),
               (((double)(iVar4 - local_64) * 100.0) / (double)iVar5) /
               (double)(int)(LatchesBest - uVar1),pcVar6,(ulong)(uint)IterBest,(ulong)uVar1,
               (ulong)uVar2);
      }
      DelayBest = IterBest;
      local_64 = Abc_NtkLatchNum(pNtk);
      LatchesBest = uVar1;
    }
    if (((IterBest == nIterLimit) || (0x14 < IterBest - DelayBest)) ||
       ((0 < nDelayLim && ((int)uVar1 <= nDelayLim)))) break;
    for (DelayCur = 0; iVar3 = Vec_PtrSize(vCritical_00), DelayCur < iVar3; DelayCur = DelayCur + 1)
    {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vCritical_00,DelayCur);
      iVar3 = Abc_NtkRetimeNodeIsEnabled(pObj_00,fForward);
      if (iVar3 != 0) {
        Abc_NtkRetimeNode(pObj_00,fForward,fInitial);
      }
    }
    if (fForward == 0) {
      Abc_NtkRetimeShareLatches(pNtk,fInitial);
    }
    IterBest = IterBest + 1;
  }
  Vec_PtrFree(vCritical_00);
  if (fInitial != 0) {
    if (fForward == 0) {
      Abc_NtkRetimeBackwardInitialFinish(pNtk,(Abc_Ntk_t *)vCritical,(Vec_Int_t *)pObj,fVerbose);
      Abc_NtkDelete((Abc_Ntk_t *)vCritical);
      Vec_IntFree((Vec_Int_t *)pObj);
    }
    else {
      Abc_NtkRetimeTranferFromCopy(pNtk);
    }
  }
  if ((fVerbose != 0) && (fInitial == 0)) {
    pcVar6 = "Backward";
    if (fForward != 0) {
      pcVar6 = "Forward ";
    }
    printf("%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n",pcVar6,
           (ulong)local_60,(ulong)(uint)LatchesBest,(ulong)(uint)DelayBest,(ulong)(uint)nIterLimit);
  }
  if (nIterLimit == 1) {
    local_9c = 1;
  }
  else {
    local_9c = DelayBest;
  }
  *pIterBest = local_9c;
  return LatchesBest;
}

Assistant:

int Abc_NtkRetimeMinDelayTry( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fInitial, int nIterLimit, int * pIterBest, int fVerbose )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vCritical;
    Vec_Int_t * vValues = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pObj;
    int i, k, IterBest, DelayCur, DelayBest;
    int DelayStart = -1; // Suppress "might be used uninitialized"
    int LatchesBest;
    // transfer intitial values
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferToCopy( pNtk );
        else
        {
            // save initial value of the latches
            vValues = Abc_NtkRetimeCollectLatchValues( pNtk );
            // start the network for initial value computation
            pNtkNew = Abc_NtkRetimeBackwardInitialStart( pNtk );
        }
    }

if ( fVerbose && !fInitial )
    printf( "Performing analysis:\n" );
    // find the best iteration
    DelayBest = ABC_INFINITY; IterBest = 0; LatchesBest = Abc_NtkLatchNum(pNtk);
    vCritical = Vec_PtrAlloc( 100 );
    for ( i = 0; ; i++ )
    {
        // perform moves for the timing-critical nodes
        DelayCur = Abc_NtkRetimeTiming( pNtk, fForward, vCritical );
        if ( i == 0 )
            DelayStart = DelayCur;
        // record this position if it has the best delay
        if ( DelayBest > DelayCur )
        {
if ( fVerbose && !fInitial )
    printf( "%s Iter = %3d. Delay = %3d. Latches = %5d. Delta = %6.2f. Ratio = %4.2f %%\n", 
        fForward ? "Fwd": "Bwd", i, DelayCur, Abc_NtkLatchNum(pNtk), 
        1.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/(DelayBest-DelayCur), 
        100.0*(Abc_NtkLatchNum(pNtk)-LatchesBest)/Abc_NtkLatchNum(pNtk)/(DelayBest-DelayCur) );

            DelayBest = DelayCur;
            IterBest = i;
            LatchesBest = Abc_NtkLatchNum(pNtk);
        }
        // quit after timing analysis
        if ( i == nIterLimit )
            break;
        // skip if 10 interations did not give improvement
        if ( i - IterBest > 20 )
            break;
        // skip if delay limit is reached
        if ( nDelayLim > 0 && DelayCur <= nDelayLim )
            break;
        // try retiming to improve the delay
        Vec_PtrForEachEntry( Abc_Obj_t *, vCritical, pObj, k )
            if ( Abc_NtkRetimeNodeIsEnabled(pObj, fForward) )
                Abc_NtkRetimeNode( pObj, fForward, fInitial );
        // share latches
        if ( !fForward )
            Abc_NtkRetimeShareLatches( pNtk, fInitial );    
    }
    Vec_PtrFree( vCritical );
    // transfer the initial state back to the latches
    if ( fInitial )
    {
        if ( fForward )
            Abc_NtkRetimeTranferFromCopy( pNtk );
        else
        {
            Abc_NtkRetimeBackwardInitialFinish( pNtk, pNtkNew, vValues, fVerbose );
            Abc_NtkDelete( pNtkNew );
            Vec_IntFree( vValues );
        }
    }
if ( fVerbose && !fInitial )
    printf( "%s : Starting delay = %3d.  Final delay = %3d.  IterBest = %2d (out of %2d).\n", 
        fForward? "Forward " : "Backward", DelayStart, DelayBest, IterBest, nIterLimit );
    *pIterBest = (nIterLimit == 1) ? 1 : IterBest;
    return DelayBest;
}